

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t> * __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::coboundary
          (coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *__return_storage_ptr__,directed_flag_complex_computer_t *this,filtration_entry_t cell)

{
  coefficient_t cVar1;
  int iVar2;
  pointer puVar3;
  long lVar4;
  int iVar5;
  pointer pcVar6;
  long lVar7;
  long lVar8;
  
  iVar2 = this->current_dimension;
  if (((int)(uint)this->max_dimension < iVar2) || (this->_is_top_dimension != false)) {
    pcVar6 = (this->coboundary_matrix).
             super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = -1;
  }
  else {
    puVar3 = (this->coboundary_matrix_offsets).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = -1;
    do {
      lVar8 = this->nb_threads - 1;
      if ((1 - this->nb_threads) + lVar7 == -1) break;
      lVar8 = lVar7 + 1;
      lVar4 = lVar7 + 2;
      lVar7 = lVar8;
    } while ((int)puVar3[lVar4] <= cell.super_pair<float,_int>.second);
    pcVar6 = (this->coboundary_matrix).
             super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8;
    iVar5 = cell.super_pair<float,_int>.second - (int)puVar3[lVar8];
  }
  cVar1 = this->modulus;
  __return_storage_ptr__->complex = this;
  __return_storage_ptr__->dimension = (short)iVar2;
  __return_storage_ptr__->matrix = pcVar6;
  __return_storage_ptr__->index = iVar5;
  __return_storage_ptr__->coefficient = 1;
  __return_storage_ptr__->modulus = cVar1;
  __return_storage_ptr__->current_offset = 0;
  return __return_storage_ptr__;
}

Assistant:

inline coboundary_iterator_t<directed_flag_complex_computer_t> coboundary(filtration_entry_t cell) {
		if (current_dimension > max_dimension || is_top_dimension()) {
			return coboundary_iterator_t<directed_flag_complex_computer_t>(this, current_dimension,
			                                                               coboundary_matrix[0], -1, 1, modulus);
		}

		size_t i = 0;
		while (i < nb_threads - 1 && index_t(coboundary_matrix_offsets[i + 1]) <= get_index(cell)) { i++; }
		return coboundary_iterator_t<directed_flag_complex_computer_t>(
		    this, current_dimension, coboundary_matrix[i], get_index(cell) - index_t(coboundary_matrix_offsets[i]),
		    get_coefficient(cell), modulus);
	}